

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O0

string * __thiscall
ShOpcodeFormatter::formatOpcode_abi_cxx11_
          (ShOpcodeFormatter *this,ShOpcodeData *opData,ShRegisterData *regData,
          ShImmediateData *immData)

{
  ulong uVar1;
  ShImmediateData *immData_local;
  ShRegisterData *regData_local;
  ShOpcodeData *opData_local;
  ShOpcodeFormatter *this_local;
  
  std::__cxx11::string::operator=((string *)this,"   ");
  handleOpcodeName(this,opData);
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (10 < uVar1) break;
    std::__cxx11::string::operator+=((string *)this,' ');
  }
  handleOpcodeParameters(this,opData,regData,immData);
  return &this->buffer;
}

Assistant:

const std::string& ShOpcodeFormatter::formatOpcode(const ShOpcodeData& opData, const ShRegisterData& regData,
	const ShImmediateData& immData)
{
	buffer = "   ";
	handleOpcodeName(opData);

	while (buffer.size() < 11)
		buffer += ' ';

	handleOpcodeParameters(opData,regData,immData);
	return buffer;
}